

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglpaintengine.cpp
# Opt level: O1

void __thiscall
QOpenGL2PaintEngineExPrivate::updateCompositionMode(QOpenGL2PaintEngineExPrivate *this)

{
  long lVar1;
  char cVar2;
  OpenGLFeature OVar3;
  undefined8 *puVar4;
  long lVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  
  OVar3 = QOpenGLContext::functions();
  cVar2 = QOpenGLFunctions::hasOpenGLFeature(OVar3);
  lVar1 = *(long *)&this->q->field_0x8;
  lVar5 = lVar1 + -8;
  if (lVar1 == 0) {
    lVar5 = 0;
  }
  if (cVar2 == '\0') {
    if (0xc < *(int *)(lVar5 + 0x1b4)) {
      updateCompositionMode();
      goto LAB_001424e6;
    }
  }
  else {
    if (*(int *)(lVar5 + 0x1b4) < 0xd) {
      (**(code **)(*(long *)&this->funcs + 0x70))(0x9285);
      puVar4 = (undefined8 *)(*(long *)&this->funcs + 0x1b0);
      uVar7 = 0x8006;
    }
    else {
      puVar4 = (undefined8 *)(*(long *)&this->funcs + 0x88);
      uVar7 = 0x9285;
    }
    (*(code *)*puVar4)(uVar7);
    lVar1 = *(long *)&this->q->field_0x8;
    lVar5 = lVar1 + -8;
    if (lVar1 == 0) {
      lVar5 = 0;
    }
    QOpenGLEngineShaderManager::setCompositionMode
              ((QOpenGLEngineShaderManager *)this->shaderManager,*(CompositionMode *)(lVar5 + 0x1b4)
              );
  }
  lVar1 = *(long *)&this->q->field_0x8;
  lVar5 = lVar1 + -8;
  if (lVar1 == 0) {
    lVar5 = 0;
  }
  switch(*(undefined4 *)(lVar5 + 0x1b4)) {
  case 0:
    lVar5 = *(long *)&this->funcs;
    uVar7 = 1;
    goto LAB_001424ae;
  case 1:
    lVar5 = *(long *)&this->funcs;
    uVar7 = 0x305;
    goto LAB_00142421;
  case 2:
    lVar5 = *(long *)&this->funcs;
    uVar7 = 0;
    goto LAB_00142459;
  case 3:
    lVar5 = *(long *)&this->funcs;
    uVar7 = 1;
    goto LAB_00142459;
  case 4:
    lVar5 = *(long *)&this->funcs;
    uVar7 = 0;
    goto LAB_00142421;
  case 5:
    lVar5 = *(long *)&this->funcs;
    uVar7 = 0x304;
    goto LAB_00142459;
  case 6:
    lVar5 = *(long *)&this->funcs;
    uVar7 = 0;
    goto LAB_0014249e;
  case 7:
    lVar5 = *(long *)&this->funcs;
    uVar7 = 0x305;
LAB_00142459:
    uVar6 = 0;
    goto LAB_001424b3;
  case 8:
    lVar5 = *(long *)&this->funcs;
    uVar7 = 0;
    goto LAB_001424ae;
  case 9:
    lVar5 = *(long *)&this->funcs;
    uVar7 = 0x304;
    goto LAB_001424ae;
  case 10:
    lVar5 = *(long *)&this->funcs;
    uVar7 = 0x305;
LAB_0014249e:
    uVar6 = 0x302;
    goto LAB_001424b3;
  case 0xb:
    lVar5 = *(long *)&this->funcs;
    uVar7 = 0x305;
LAB_001424ae:
    uVar6 = 0x303;
LAB_001424b3:
    (**(code **)(lVar5 + 8))(uVar7,uVar6);
    goto LAB_001424e6;
  case 0xc:
    lVar5 = *(long *)&this->funcs;
    uVar7 = 1;
LAB_00142421:
    uVar6 = 1;
    goto LAB_001424b3;
  case 0xd:
    lVar5 = *(long *)&this->funcs;
    uVar7 = 0x9294;
    break;
  case 0xe:
    lVar5 = *(long *)&this->funcs;
    uVar7 = 0x9295;
    break;
  case 0xf:
    lVar5 = *(long *)&this->funcs;
    uVar7 = 0x9296;
    break;
  case 0x10:
    lVar5 = *(long *)&this->funcs;
    uVar7 = 0x9297;
    break;
  case 0x11:
    lVar5 = *(long *)&this->funcs;
    uVar7 = 0x9298;
    break;
  case 0x12:
    lVar5 = *(long *)&this->funcs;
    uVar7 = 0x9299;
    break;
  case 0x13:
    lVar5 = *(long *)&this->funcs;
    uVar7 = 0x929a;
    break;
  case 0x14:
    lVar5 = *(long *)&this->funcs;
    uVar7 = 0x929b;
    break;
  case 0x15:
    lVar5 = *(long *)&this->funcs;
    uVar7 = 0x929c;
    break;
  case 0x16:
    lVar5 = *(long *)&this->funcs;
    uVar7 = 0x929e;
    break;
  case 0x17:
    lVar5 = *(long *)&this->funcs;
    uVar7 = 0x92a0;
    break;
  default:
    updateCompositionMode();
    goto LAB_001424e6;
  }
  (**(code **)(lVar5 + 0x1b0))(uVar7);
LAB_001424e6:
  this->compositionModeDirty = false;
  return;
}

Assistant:

void QOpenGL2PaintEngineExPrivate::updateCompositionMode()
{
    // NOTE: The entire paint engine works on pre-multiplied data - which is why some of these
    //       composition modes look odd.
//     qDebug() << "QOpenGL2PaintEngineExPrivate::updateCompositionMode() - Setting GL composition mode for " << q->state()->composition_mode;
    if (ctx->functions()->hasOpenGLFeature(QOpenGLFunctions::BlendEquationAdvanced)) {
       if (q->state()->composition_mode <= QPainter::CompositionMode_Plus) {
           funcs.glDisable(GL_BLEND_ADVANCED_COHERENT_KHR);
           funcs.glBlendEquation(GL_FUNC_ADD);
       } else {
           funcs.glEnable(GL_BLEND_ADVANCED_COHERENT_KHR);
       }
       shaderManager->setCompositionMode(q->state()->composition_mode);
    } else {
        if (q->state()->composition_mode > QPainter::CompositionMode_Plus) {
            qWarning("Unsupported composition mode");
            compositionModeDirty = false;
            return;
        }
    }
    switch(q->state()->composition_mode) {
    case QPainter::CompositionMode_SourceOver:
        funcs.glBlendFunc(GL_ONE, GL_ONE_MINUS_SRC_ALPHA);
        break;
    case QPainter::CompositionMode_DestinationOver:
        funcs.glBlendFunc(GL_ONE_MINUS_DST_ALPHA, GL_ONE);
        break;
    case QPainter::CompositionMode_Clear:
        funcs.glBlendFunc(GL_ZERO, GL_ZERO);
        break;
    case QPainter::CompositionMode_Source:
        funcs.glBlendFunc(GL_ONE, GL_ZERO);
        break;
    case QPainter::CompositionMode_Destination:
        funcs.glBlendFunc(GL_ZERO, GL_ONE);
        break;
    case QPainter::CompositionMode_SourceIn:
        funcs.glBlendFunc(GL_DST_ALPHA, GL_ZERO);
        break;
    case QPainter::CompositionMode_DestinationIn:
        funcs.glBlendFunc(GL_ZERO, GL_SRC_ALPHA);
        break;
    case QPainter::CompositionMode_SourceOut:
        funcs.glBlendFunc(GL_ONE_MINUS_DST_ALPHA, GL_ZERO);
        break;
    case QPainter::CompositionMode_DestinationOut:
        funcs.glBlendFunc(GL_ZERO, GL_ONE_MINUS_SRC_ALPHA);
        break;
    case QPainter::CompositionMode_SourceAtop:
        funcs.glBlendFunc(GL_DST_ALPHA, GL_ONE_MINUS_SRC_ALPHA);
        break;
    case QPainter::CompositionMode_DestinationAtop:
        funcs.glBlendFunc(GL_ONE_MINUS_DST_ALPHA, GL_SRC_ALPHA);
        break;
    case QPainter::CompositionMode_Xor:
        funcs.glBlendFunc(GL_ONE_MINUS_DST_ALPHA, GL_ONE_MINUS_SRC_ALPHA);
        break;
    case QPainter::CompositionMode_Plus:
        funcs.glBlendFunc(GL_ONE, GL_ONE);
        break;
    case QPainter::CompositionMode_Multiply:
        funcs.glBlendEquation(GL_MULTIPLY_KHR);
        break;
    case QPainter::CompositionMode_Screen:
        funcs.glBlendEquation(GL_SCREEN_KHR);
        break;
    case QPainter::CompositionMode_Overlay:
        funcs.glBlendEquation(GL_OVERLAY_KHR);
        break;
    case QPainter::CompositionMode_Darken:
        funcs.glBlendEquation(GL_DARKEN_KHR);
        break;
    case QPainter::CompositionMode_Lighten:
        funcs.glBlendEquation(GL_LIGHTEN_KHR);
        break;
    case QPainter::CompositionMode_ColorDodge:
        funcs.glBlendEquation(GL_COLORDODGE_KHR);
        break;
    case QPainter::CompositionMode_ColorBurn:
        funcs.glBlendEquation(GL_COLORBURN_KHR);
        break;
    case QPainter::CompositionMode_HardLight:
        funcs.glBlendEquation(GL_HARDLIGHT_KHR);
        break;
    case QPainter::CompositionMode_SoftLight:
        funcs.glBlendEquation(GL_SOFTLIGHT_KHR);
        break;
    case QPainter::CompositionMode_Difference:
        funcs.glBlendEquation(GL_DIFFERENCE_KHR);
        break;
    case QPainter::CompositionMode_Exclusion:
        funcs.glBlendEquation(GL_EXCLUSION_KHR);
        break;
    default:
        qWarning("Unsupported composition mode");
        break;
    }

    compositionModeDirty = false;
}